

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

optional<slang::TimeScale> __thiscall slang::ast::Scope::getTimeScale(Scope *this)

{
  SymbolKind SVar1;
  Scope *pSVar2;
  Symbol *pSVar3;
  Scope *current;
  
  pSVar2 = this;
  do {
    pSVar3 = pSVar2->thisSym;
    SVar1 = pSVar3->kind;
    if (SVar1 == Package) {
      pSVar3 = pSVar3 + 2;
      goto LAB_007301a3;
    }
    if (SVar1 == InstanceBody) {
      pSVar3 = (Symbol *)(pSVar3[2].name._M_str + 0x55);
      goto LAB_007301a3;
    }
    if (SVar1 == CompilationUnit) {
      pSVar3 = (Symbol *)&pSVar3[1].originatingSyntax;
      goto LAB_007301a3;
    }
    pSVar2 = pSVar3->parentScope;
  } while (pSVar2 != (Scope *)0x0);
  pSVar3 = (Symbol *)&(this->compilation->options).defaultTimeScale;
LAB_007301a3:
  return (_Optional_base<slang::TimeScale,_true,_true>)
         (_Optional_payload<slang::TimeScale,_true,_true,_true>)
         *(_Optional_payload<slang::TimeScale,_true,_true,_true> *)pSVar3;
}

Assistant:

std::optional<TimeScale> Scope::getTimeScale() const {
    const Scope* current = this;
    do {
        auto& sym = current->asSymbol();
        switch (sym.kind) {
            case SymbolKind::CompilationUnit:
                return sym.as<CompilationUnitSymbol>().timeScale;
            case SymbolKind::Package:
                return sym.as<PackageSymbol>().timeScale;
            case SymbolKind::InstanceBody:
                return sym.as<InstanceBodySymbol>().getDefinition().timeScale;
            default:
                current = sym.getParentScope();
                break;
        }
    } while (current);

    return getCompilation().getDefaultTimeScale();
}